

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__png_is16(stbi__context *s)

{
  int iVar1;
  stbi__context *in_RDI;
  stbi__png p;
  int *in_stack_ffffffffffffffd0;
  stbi__png *in_stack_ffffffffffffffd8;
  undefined4 local_18;
  undefined4 local_4;
  
  iVar1 = stbi__png_info_raw(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(int *)in_RDI,
                             (int *)0x444724);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else if (local_18 == 0x10) {
    local_4 = 1;
  }
  else {
    stbi__rewind(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int stbi__png_is16(stbi__context *s)
{
   stbi__png p;
   p.s = s;
   if (!stbi__png_info_raw(&p, NULL, NULL, NULL))
	   return 0;
   if (p.depth != 16) {
      stbi__rewind(p.s);
      return 0;
   }
   return 1;
}